

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

Point2f pbrt::InvertSphericalRectangleSample
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point3f *pRect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  type d;
  type d_00;
  Float FVar16;
  Float FVar17;
  Float FVar18;
  Float FVar19;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  Tuple2<pbrt::Point2,_float> TVar22;
  undefined4 extraout_XMM0_Dc;
  ulong uVar45;
  undefined1 auVar46 [56];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar23 [16];
  undefined1 extraout_var_04 [56];
  undefined1 auVar38 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar27 [16];
  undefined1 auVar44 [64];
  uint uVar51;
  uint uVar52;
  uint uVar53;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  undefined1 in_XMM10 [16];
  Vector3<float> VVar66;
  Vector3<float> VVar67;
  Vector3f VVar68;
  Vector3f v11;
  Vector3f v10;
  Vector3f v01;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  Tuple3<pbrt::Vector3,_float> local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  Tuple3<pbrt::Vector3,_float> local_c0;
  Tuple3<pbrt::Vector3,_float> local_b0;
  Tuple3<pbrt::Vector3,_float> local_a0;
  Tuple3<pbrt::Vector3,_float> local_90;
  Frame local_84;
  Tuple3<pbrt::Vector3,_float> local_60;
  Vector3<float> local_54;
  Vector3<float> local_48;
  Vector3<float> local_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 auVar47 [56];
  
  d = Length<float>(ex);
  d_00 = Length<float>(ey);
  uVar45 = 0;
  VVar66 = Tuple3<pbrt::Vector3,float>::operator/((Tuple3<pbrt::Vector3,float> *)ex,d);
  VVar67 = Tuple3<pbrt::Vector3,float>::operator/((Tuple3<pbrt::Vector3,float> *)ey,d_00);
  uVar51 = 0;
  uVar52 = 0;
  uVar53 = 0;
  auVar46 = ZEXT856(uVar45);
  Frame::FromXY(&local_84,(Vector3f)VVar66.super_Tuple3<pbrt::Vector3,_float>,
                (Vector3f)VVar67.super_Tuple3<pbrt::Vector3,_float>);
  VVar66 = Point3<float>::operator-(s,pRef);
  VVar68 = Frame::ToLocal(&local_84,VVar66.super_Tuple3<pbrt::Vector3,_float>);
  local_60.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar29._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar29._8_56_ = auVar46;
  if (0.0 < local_60.z) {
    auVar59._0_8_ = local_84.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    auVar59._8_4_ = 0x80000000;
    auVar59._12_4_ = 0x80000000;
    local_60.z = -local_60.z;
    uVar51 = uVar51 ^ 0x80000000;
    uVar52 = uVar52 ^ 0x80000000;
    uVar53 = uVar53 ^ 0x80000000;
    local_84.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar59);
    local_84.z.super_Tuple3<pbrt::Vector3,_float>.z =
         -local_84.z.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  local_d8 = auVar29._0_16_;
  auVar59 = vmovshdup_avx(local_d8);
  local_3c.super_Tuple3<pbrt::Vector3,_float>.x = VVar68.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar2 = local_3c.super_Tuple3<pbrt::Vector3,_float>.x + d;
  local_48.super_Tuple3<pbrt::Vector3,_float>.y = auVar59._0_4_;
  fVar3 = local_48.super_Tuple3<pbrt::Vector3,_float>.y + d_00;
  local_e8._4_4_ = uVar51;
  local_e8._0_4_ = local_60.z;
  local_e8._8_4_ = uVar52;
  local_e8._12_4_ = uVar53;
  local_60._0_8_ = vmovlps_avx(local_d8);
  local_54.super_Tuple3<pbrt::Vector3,_float>.x = fVar2;
  local_54.super_Tuple3<pbrt::Vector3,_float>.y = fVar3;
  local_54.super_Tuple3<pbrt::Vector3,_float>.z = local_60.z;
  local_48.super_Tuple3<pbrt::Vector3,_float>.x = fVar2;
  local_48.super_Tuple3<pbrt::Vector3,_float>.z = local_60.z;
  local_3c.super_Tuple3<pbrt::Vector3,_float>.y = fVar3;
  local_3c.super_Tuple3<pbrt::Vector3,_float>.z = local_60.z;
  VVar66 = Cross<float>((Vector3<float> *)&local_60,&local_48);
  local_90.z = VVar66.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar30._0_8_ = VVar66.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar30._8_56_ = auVar46;
  local_90._0_8_ = vmovlps_avx(auVar30._0_16_);
  VVar66 = Normalize<float>((Vector3<float> *)&local_90);
  auVar31._0_8_ = VVar66.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar31._8_56_ = auVar46;
  local_b0._0_8_ = vmovlps_avx(auVar31._0_16_);
  auVar47 = auVar46;
  local_b0.z = VVar66.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar67 = Cross<float>(&local_48,&local_54);
  local_c0.z = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar32._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar32._8_56_ = auVar47;
  local_c0._0_8_ = vmovlps_avx(auVar32._0_16_);
  VVar67 = Normalize<float>((Vector3<float> *)&local_c0);
  local_90.z = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar33._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar33._8_56_ = auVar47;
  local_90._0_8_ = vmovlps_avx(auVar33._0_16_);
  VVar67 = Cross<float>(&local_54,&local_3c);
  local_a0.z = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar34._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar34._8_56_ = auVar47;
  local_a0._0_8_ = vmovlps_avx(auVar34._0_16_);
  VVar67 = Normalize<float>((Vector3<float> *)&local_a0);
  local_c0.z = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar35._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar35._8_56_ = auVar47;
  local_c0._0_8_ = vmovlps_avx(auVar35._0_16_);
  VVar67 = Cross<float>(&local_3c,(Vector3<float> *)&local_60);
  local_f8.z = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar36._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar36._8_56_ = auVar47;
  local_f8._0_8_ = vmovlps_avx(auVar36._0_16_);
  VVar67 = Normalize<float>((Vector3<float> *)&local_f8);
  local_a0.z = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar37._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar37._8_56_ = auVar47;
  local_a0._0_8_ = vmovlps_avx(auVar37._0_16_);
  auVar23._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
  auVar23._8_4_ = auVar46._0_4_ ^ 0x80000000;
  auVar23._12_4_ = auVar46._4_4_ ^ 0x80000000;
  local_f8.z = -VVar66.super_Tuple3<pbrt::Vector3,_float>.z;
  local_f8._0_8_ = vmovlps_avx(auVar23);
  FVar16 = AngleBetween<float>((Vector3<float> *)&local_f8,(Vector3<float> *)&local_90);
  auVar14._0_8_ = local_90._0_8_ ^ 0x8000000080000000;
  auVar14._8_4_ = 0x80000000;
  auVar14._12_4_ = 0x80000000;
  local_f8.z = -local_90.z;
  local_f8._0_8_ = vmovlps_avx(auVar14);
  FVar17 = AngleBetween<float>((Vector3<float> *)&local_f8,(Vector3<float> *)&local_c0);
  auVar11._0_8_ = local_c0._0_8_ ^ 0x8000000080000000;
  auVar11._8_4_ = 0x80000000;
  auVar11._12_4_ = 0x80000000;
  local_f8.z = -local_c0.z;
  local_f8._0_8_ = vmovlps_avx(auVar11);
  FVar18 = AngleBetween<float>((Vector3<float> *)&local_f8,(Vector3<float> *)&local_a0);
  auVar27._0_8_ = local_a0._0_8_ ^ 0x8000000080000000;
  auVar27._8_4_ = 0x80000000;
  auVar27._12_4_ = 0x80000000;
  local_f8.z = -local_a0.z;
  local_f8._0_8_ = vmovlps_avx(auVar27);
  FVar19 = AngleBetween<float>((Vector3<float> *)&local_f8,(Vector3<float> *)&local_b0);
  fVar21 = local_c0.z;
  fVar1 = FVar16 + FVar17 + FVar18 + FVar19 + -6.2831855;
  if (0.001 <= fVar1) {
    fVar4 = (float)local_e8._0_4_ * (float)local_e8._0_4_;
    local_e8._0_4_ = local_b0.z;
    fVar65 = local_b0.z * local_b0.z;
    auVar46 = (undefined1  [56])0x0;
    VVar66 = Point3<float>::operator-(pRect,pRef);
    VVar68 = Frame::ToLocal(&local_84,VVar66.super_Tuple3<pbrt::Vector3,_float>);
    auVar40._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar40._8_56_ = auVar46;
    auVar14 = auVar40._0_16_;
    auVar23 = vminss_avx(ZEXT416((uint)fVar2),auVar14);
    uVar5 = vcmpss_avx512f(auVar14,local_d8,1);
    bVar6 = (bool)((byte)uVar5 & 1);
    auVar13._4_12_ = auVar23._4_12_;
    auVar13._0_4_ = (uint)bVar6 * local_d8._0_4_ + (uint)!bVar6 * auVar23._0_4_;
    uVar5 = vcmpss_avx512f(auVar13,ZEXT816(0) << 0x40,0);
    bVar6 = (bool)((byte)uVar5 & 1);
    fVar2 = (float)((uint)bVar6 * 0x2edbe6ff + (uint)!bVar6 * auVar13._0_4_);
    fVar65 = (fVar4 / (fVar2 * fVar2) + 1.0) - fVar65;
    if (fVar65 < 0.0) {
      auVar41._0_4_ = sqrtf(fVar65);
      auVar41._4_60_ = extraout_var_00;
      auVar23 = auVar41._0_16_;
    }
    else {
      auVar23 = vsqrtss_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
    }
    if (InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
        ::reg == '\0') {
      iVar10 = __cxa_guard_acquire(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                                    ::reg);
      if (iVar10 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                    ::reg,InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::
                          Point3<float>const&,pbrt::Vector3<float>const&,pbrt::
                          Vector3<float>const&,pbrt::Point3<float>const&)::$_0::__invoke(pbrt::
                          StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                             ::reg);
      }
    }
    *(long *)(in_FS_OFFSET + -0x280) = *(long *)(in_FS_OFFSET + -0x280) + 1;
    auVar59 = vinsertps_avx(auVar59,ZEXT416((uint)fVar3),0x10);
    auVar12._8_4_ = 0x7fffffff;
    auVar12._0_8_ = 0x7fffffff7fffffff;
    auVar12._12_4_ = 0x7fffffff;
    auVar11 = vpternlogd_avx512vl(ZEXT416((uint)fVar2),auVar23,auVar12,0xd8);
    if ((auVar11._0_4_ == 0.0) && (!NAN(auVar11._0_4_))) {
      *(long *)(in_FS_OFFSET + -0x288) = *(long *)(in_FS_OFFSET + -0x288) + 1;
    }
    auVar27 = vfmsub213ss_fma(ZEXT416((uint)local_e8._0_4_),ZEXT416((uint)local_e8._0_4_),
                              ZEXT416((uint)(fVar21 * fVar21)));
    auVar62 = ZEXT416((uint)fVar21);
    auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),auVar62,auVar62);
    auVar27 = vmaxss_avx(ZEXT416((uint)(auVar27._0_4_ + auVar13._0_4_ + fVar65)),ZEXT816(0) << 0x40)
    ;
    auVar27 = vsqrtss_avx(auVar27,auVar27);
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(auVar11,auVar8);
    auVar63._8_4_ = 0x7fffffff;
    auVar63._0_8_ = 0x7fffffff7fffffff;
    auVar63._12_4_ = 0x7fffffff;
    auVar13 = vpternlogd_avx512vl(ZEXT416((uint)((float)local_e8._0_4_ * auVar12._0_4_)),auVar63,
                                  ZEXT416((uint)((float)local_e8._0_4_ * auVar27._0_4_)),0xb8);
    auVar23 = vpand_avx(auVar63,auVar23);
    auVar13 = vfnmadd231ss_fma(auVar13,auVar62,auVar11);
    auVar23 = vfmsub231ss_fma(ZEXT416((uint)(auVar23._0_4_ * auVar27._0_4_)),
                              ZEXT416((uint)local_e8._0_4_),auVar62);
    auVar42._0_4_ = atan2f(auVar13._0_4_,auVar23._0_4_);
    auVar42._4_60_ = extraout_var_01;
    uVar5 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar42._0_16_,1);
    bVar6 = (bool)((byte)uVar5 & 1);
    uVar5 = vcmpss_avx512f(auVar11,ZEXT416((uint)auVar12._0_4_),0);
    bVar7 = (bool)((byte)uVar5 & 1);
    fVar4 = fVar2 * fVar2 + fVar4;
    auVar24._0_4_ = fVar4 + auVar59._0_4_ * auVar59._0_4_;
    auVar24._4_4_ = fVar4 + auVar59._4_4_ * auVar59._4_4_;
    auVar24._8_4_ = fVar4 + auVar59._8_4_ * auVar59._8_4_;
    auVar24._12_4_ = fVar4 + auVar59._12_4_ * auVar59._12_4_;
    auVar23 = vsqrtps_avx(auVar24);
    auVar59 = vdivps_avx(auVar59,auVar23);
    local_118._0_4_ = VVar68.super_Tuple3<pbrt::Vector3,_float>.x;
    local_118._4_4_ = VVar68.super_Tuple3<pbrt::Vector3,_float>.y;
    fStack_110 = auVar46._0_4_;
    fStack_10c = auVar46._4_4_;
    auVar25._0_4_ = (float)local_118._0_4_ * (float)local_118._0_4_;
    auVar25._4_4_ = (float)local_118._4_4_ * (float)local_118._4_4_;
    auVar25._8_4_ = fStack_110 * fStack_110;
    auVar25._12_4_ = fStack_10c * fStack_10c;
    auVar23 = vmovshdup_avx(auVar59);
    auVar11 = vmovshdup_avx(auVar25);
    fVar58 = auVar59._0_4_;
    fVar61 = auVar23._0_4_;
    fVar65 = fVar58 - fVar61;
    auVar27 = vfmsub213ss_fma(auVar59,auVar59,ZEXT416((uint)(fVar58 * fVar61)));
    auVar59 = vfnmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar61)),auVar59,auVar23);
    fVar2 = auVar11._0_4_ + fVar4;
    auVar62._8_4_ = 0x7fffffff;
    auVar62._0_8_ = 0x7fffffff7fffffff;
    auVar62._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)fVar65),auVar62);
    fVar3 = auVar27._0_4_ + auVar59._0_4_;
    fVar21 = auVar11._0_4_ * fVar2;
    if (fVar21 < 0.0) {
      local_d8._0_4_ = fVar21;
      local_e8 = ZEXT416((uint)fVar65);
      fVar20 = sqrtf(fVar21);
      fVar21 = (float)local_d8._0_4_;
      fVar65 = (float)local_e8._0_4_;
    }
    else {
      auVar59 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
      fVar20 = auVar59._0_4_;
    }
    fVar64 = (float)((uint)bVar7 * 0x40490fdb +
                    (uint)!bVar7 *
                    ((uint)bVar6 * (int)(auVar42._0_4_ + -6.2831855) +
                    (uint)!bVar6 * (int)auVar42._0_4_)) + FVar18;
    fVar65 = fVar65 * fVar65;
    if (fVar21 < 0.0) {
      local_d8._0_4_ = fVar64;
      fVar21 = sqrtf(fVar21);
      fVar64 = (float)local_d8._0_4_;
    }
    else {
      auVar59 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
      fVar21 = auVar59._0_4_;
    }
    auVar11 = vsqrtss_avx(in_XMM10,ZEXT416((uint)fVar4));
    auVar50._8_4_ = 0x3f800000;
    auVar50._0_8_ = 0x3f8000003f800000;
    auVar50._12_4_ = 0x3f800000;
    auVar55._4_4_ = fVar65;
    auVar55._0_4_ = fVar65;
    auVar55._8_4_ = fVar65;
    auVar55._12_4_ = fVar65;
    auVar59 = vinsertps_avx(ZEXT416((uint)(fVar3 - (auVar13._0_4_ * fVar20) / fVar2)),
                            ZEXT416((uint)(fVar3 + (auVar13._0_4_ * fVar21) / fVar2)),0x10);
    auVar59 = vdivps_avx(auVar59,auVar55);
    fStack_1a4 = auVar23._4_4_;
    fStack_1a0 = auVar23._8_4_;
    fStack_19c = auVar23._12_4_;
    auVar60._0_4_ = auVar59._0_4_ * fVar61;
    auVar60._4_4_ = auVar59._4_4_ * fStack_1a4;
    auVar60._8_4_ = auVar59._8_4_ * fStack_1a0;
    auVar60._12_4_ = auVar59._12_4_ * fStack_19c;
    auVar23 = vsubps_avx(auVar50,auVar59);
    auVar56._4_4_ = fVar58;
    auVar56._0_4_ = fVar58;
    auVar56._8_4_ = fVar58;
    auVar56._12_4_ = fVar58;
    auVar23 = vfmadd213ps_fma(auVar56,auVar23,auVar60);
    fVar2 = auVar23._0_4_;
    auVar26._0_4_ = fVar2 * fVar2;
    fVar3 = auVar23._4_4_;
    auVar26._4_4_ = fVar3 * fVar3;
    fVar21 = auVar23._8_4_;
    auVar26._8_4_ = fVar21 * fVar21;
    fVar4 = auVar23._12_4_;
    auVar26._12_4_ = fVar4 * fVar4;
    auVar23 = vmovshdup_avx(auVar26);
    fVar65 = 1.0 - auVar26._0_4_;
    if (fVar65 < 0.0) {
      auVar43._0_4_ = sqrtf(fVar65);
      auVar43._4_60_ = extraout_var_02;
      auVar27 = auVar43._0_16_;
    }
    else {
      auVar27 = vsqrtss_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
    }
    fVar65 = auVar11._0_4_;
    auVar57._0_4_ = fVar65 * fVar2;
    auVar57._4_4_ = fVar65 * fVar3;
    auVar57._8_4_ = fVar65 * fVar21;
    auVar57._12_4_ = fVar65 * fVar4;
    fVar2 = 1.0 - auVar23._0_4_;
    if (fVar2 < 0.0) {
      auVar44._0_4_ = sqrtf(fVar2);
      auVar44._4_60_ = extraout_var_03;
      auVar23 = auVar44._0_16_;
    }
    else {
      auVar23 = vsqrtss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
    }
    auVar11 = ZEXT416((uint)((FVar19 + fVar64) / fVar1));
    auVar23 = vinsertps_avx(auVar27,auVar23,0x10);
    auVar14 = vmovshdup_avx(auVar14);
    uVar5 = vcmpss_avx512f(auVar11,ZEXT816(0) << 0x40,1);
    auVar23 = vdivps_avx(auVar57,auVar23);
    auVar23 = vsubps_avx(auVar23,auVar14);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(auVar23,auVar9);
    auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
    iVar10 = (uint)!(bool)((byte)uVar5 & 1) * auVar23._0_4_;
    auVar15._4_12_ = auVar23._4_12_;
    auVar15._0_4_ = iVar10;
    auVar23 = vshufps_avx(auVar14,auVar14,0xf5);
    if (auVar23._0_4_ <= auVar14._0_4_) {
      auVar28._4_12_ = auVar59._4_12_;
      auVar28._0_4_ = iVar10;
      TVar22 = auVar28._0_8_;
    }
    else {
      auVar59 = vinsertps_avx(auVar15,ZEXT416((uint)auVar59._0_4_),0x1c);
      TVar22 = auVar59._0_8_;
    }
  }
  else {
    auVar46 = extraout_var_04;
    VVar66 = Point3<float>::operator-(pRect,s);
    auVar49._0_4_ = VVar66.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar38._0_8_ = VVar66.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar38._8_56_ = auVar46;
    fVar2 = (ex->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar3 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
    fVar1 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
    local_118._0_4_ = LengthSquared<float>(ex);
    local_118._4_4_ = extraout_XMM0_Db;
    fStack_110 = (float)extraout_XMM0_Dc;
    fStack_10c = (float)extraout_XMM0_Dd;
    auVar59 = vinsertps_avx(ZEXT416((uint)fVar3),
                            ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).y),0x10);
    auVar23 = vinsertps_avx(ZEXT416((uint)fVar2),
                            ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x),0x10);
    auVar14 = vinsertps_avx(ZEXT416((uint)fVar1),
                            ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).z),0x10);
    auVar39._0_4_ = LengthSquared<float>(ey);
    auVar39._4_60_ = extraout_var;
    auVar11 = vmovshdup_avx(auVar38._0_16_);
    local_128 = auVar59._0_4_;
    fStack_124 = auVar59._4_4_;
    fStack_120 = auVar59._8_4_;
    fStack_11c = auVar59._12_4_;
    auVar48._0_4_ = auVar11._0_4_ * local_128;
    auVar48._4_4_ = auVar11._4_4_ * fStack_124;
    auVar48._8_4_ = auVar11._8_4_ * fStack_120;
    auVar48._12_4_ = auVar11._12_4_ * fStack_11c;
    auVar54._0_4_ = VVar66.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar54._4_4_ = auVar54._0_4_;
    auVar54._8_4_ = auVar54._0_4_;
    auVar54._12_4_ = auVar54._0_4_;
    auVar59 = vfmadd132ps_fma(auVar54,auVar48,auVar23);
    auVar49._4_4_ = auVar49._0_4_;
    auVar49._8_4_ = auVar49._0_4_;
    auVar49._12_4_ = auVar49._0_4_;
    auVar23 = vfmadd132ps_fma(auVar49,auVar59,auVar14);
    auVar59 = vinsertps_avx(_local_118,auVar39._0_16_,0x10);
    auVar59 = vdivps_avx(auVar23,auVar59);
    TVar22 = auVar59._0_8_;
  }
  return (Point2f)TVar22;
}

Assistant:

Point2f InvertSphericalRectangleSample(const Point3f &pRef, const Point3f &s,
                                       const Vector3f &ex, const Vector3f &ey,
                                       const Point3f &pRect) {
    // TODO: Delete anything unused in the below...

    // SphQuadInit()
    // local reference system 'R'
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);

    // compute rectangle coords in local reference system
    Vector3f d = s - pRef;
    Vector3f dLocal = R.ToLocal(d);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float z0sq = Sqr(z0);
    Float x0 = dLocal.x;
    Float y0 = dLocal.y;
    Float x1 = x0 + exl;
    Float y1 = y0 + eyl;
    Float y0sq = Sqr(y0), y1sq = Sqr(y1);

    // create vectors to four vertices
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);

    // compute normals to edges
    Vector3f n0 = Normalize(Cross(v00, v10));
    Vector3f n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01));
    Vector3f n3 = Normalize(Cross(v01, v00));

    // compute internal angles (gamma_i)
    Float g0 = AngleBetween(-n0, n1);
    Float g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3);
    Float g3 = AngleBetween(-n3, n0);

    // compute predefined constants
    Float b0 = n0.z, b1 = n2.z, b0sq = Sqr(b0), b1sq = Sqr(b1);

    // compute solid angle from internal angles
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;

    // TODO: this (rarely) goes differently than sample. figure out why...
    if (solidAngle < 1e-3) {
        Vector3f pq = pRect - s;
        return Point2f(Dot(pq, ex) / LengthSquared(ex), Dot(pq, ey) / LengthSquared(ey));
    }

    Vector3f v = R.ToLocal(pRect - pRef);
    Float xu = v.x, yv = v.y;

    xu = Clamp(xu, x0, x1);  // avoid Infs
    if (xu == 0)
        xu = 1e-10;

    // DOing all this in double actually makes things slightly worse???!?
    // Float fusq = (1 - b0sq * Sqr(cu)) / Sqr(cu);
    // Float fusq = 1 / Sqr(cu) - b0sq;  // more stable
    Float invcusq = 1 + z0sq / Sqr(xu);
    Float fusq = invcusq - b0sq;  // the winner so far
    Float fu = std::copysign(std::sqrt(fusq), xu);
    // Note, though have 1 + z^2/x^2 - b0^2, which isn't great if b0 \approx 1
    // double fusq = 1. - Sqr(double(b0)) + Sqr(double(z0) / double(xu));  //
    // this is worse?? double fu = std::copysign(std::sqrt(fusq), cu);
    CHECK_RARE(1e-6, fu == 0);

    // State of the floating point world: in the bad cases, about half the
    // error seems to come from inaccuracy in fu and half comes from
    // inaccuracy in sqrt/au.
    //
    // For fu, the main issue comes adding a small value to 1+ in invcusq
    // and then having b0sq be close to one, so having catastrophic
    // cancellation affect fusq. Approximating it as z0sq / Sqr(xu) when
    // b0sq is close to one doesn't help, however..
    //
    // For au, DifferenceOfProducts doesn't seem to help with the two
    // factors. Furthermore, while it would be nice to think about this
    // like atan(y/x) and then rewrite/simplify y/x, we need to do so in a
    // way that doesn't flip the sign of x and y, which would be fine if we
    // were computing y/x, but messes up atan2's quadrant-determinations...

    Float sqrt = SafeSqrt(DifferenceOfProducts(b0, b0, b1, b1) + fusq);
    // No benefit to difference of products here...
    Float au = std::atan2(-(b1 * fu) - std::copysign(b0 * sqrt, fu * b0),
                          b0 * b1 - sqrt * std::abs(fu));
    if (au > 0)
        au -= 2 * Pi;

    if (fu == 0)
        au = Pi;
    Float u0 = (au + g2 + g3) / solidAngle;

    Float ddsq = Sqr(xu) + z0sq;
    Float dd = std::sqrt(ddsq);
    Float h0 = y0 / std::sqrt(ddsq + y0sq);
    Float h1 = y1 / std::sqrt(ddsq + y1sq);
    Float yvsq = Sqr(yv);

    Float u1[2] = {(DifferenceOfProducts(h0, h0, h0, h1) -
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1),
                   (DifferenceOfProducts(h0, h0, h0, h1) +
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1)};

    // TODO: yuck is there a better way to figure out which is the right
    // solution?
    Float hv[2] = {Lerp(u1[0], h0, h1), Lerp(u1[1], h0, h1)};
    Float hvsq[2] = {Sqr(hv[0]), Sqr(hv[1])};
    Float yz[2] = {(hv[0] * dd) / std::sqrt(1 - hvsq[0]),
                   (hv[1] * dd) / std::sqrt(1 - hvsq[1])};

    Point2f u = (std::abs(yz[0] - yv) < std::abs(yz[1] - yv))
                    ? Point2f(Clamp(u0, 0, 1), u1[0])
                    : Point2f(Clamp(u0, 0, 1), u1[1]);

    return u;
}